

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_stream.c
# Opt level: O0

int log_aspect_stream_impl_write_execute_cb(log_policy policy,log_aspect_schedule_data data)

{
  int iVar1;
  log_handle handle_00;
  log_record_ctor record_ctor;
  log_record handle_01;
  undefined8 *in_RSI;
  log_policy in_RDI;
  log_aspect_stream_write_cb_data_type write_data;
  int result;
  log_record record;
  log_handle handle;
  log_policy_schedule_impl schedule_impl;
  log_aspect_stream_execute_cb_data execute_data;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_4;
  
  handle_00 = (log_handle)log_policy_derived(in_RDI);
  record_ctor = (log_record_ctor)log_impl_handle((log_impl)*in_RSI);
  iVar1 = (*(code *)handle_00->buffer)(in_RDI);
  if (iVar1 == 0) {
    handle_01 = log_handle_push(handle_00,record_ctor);
    iVar1 = (*(code *)handle_00->size)(in_RDI);
    if (iVar1 == 0) {
      if (handle_01 == (log_record)0x0) {
        local_4 = 1;
      }
      else {
        local_4 = log_aspect_notify_all
                            ((log_aspect)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (log_aspect_notify_cb)handle_01,(log_aspect_notify_data)*in_RSI);
        iVar1 = (*(code *)handle_00->buffer)(in_RDI);
        if (iVar1 == 0) {
          log_handle_pop((log_handle)handle_01);
          iVar1 = (*(code *)handle_00->size)(in_RDI);
          if (iVar1 != 0) {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int log_aspect_stream_impl_write_execute_cb(log_policy policy, log_aspect_schedule_data data)
{
	log_aspect_stream_execute_cb_data execute_data = data;

	log_policy_schedule_impl schedule_impl = log_policy_derived(policy);

	log_handle handle = log_impl_handle(execute_data->impl);

	log_record record;

	int result;

	struct log_aspect_stream_write_cb_data_type write_data;

	if (schedule_impl->lock(policy) != 0)
	{
		return 1;
	}

	record = log_handle_push(handle, execute_data->record_ctor);

	if (schedule_impl->unlock(policy) != 0)
	{
		return 1;
	}

	if (record == NULL)
	{
		return 1;
	}

	write_data.impl = execute_data->impl;
	write_data.record = record;

	result = log_aspect_notify_all(execute_data->aspect, &log_aspect_stream_impl_write_cb, (log_aspect_notify_data)&write_data);

	if (schedule_impl->lock(policy) != 0)
	{
		return 1;
	}

	log_handle_pop(handle);

	if (schedule_impl->unlock(policy) != 0)
	{
		return 1;
	}

	return result;
}